

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yyjson.cpp
# Opt level: O1

yyjson_mut_val *
duckdb_yyjson::unsafe_yyjson_mut_ptr_removex
          (yyjson_mut_val *val,char *ptr,size_t len,yyjson_ptr_ctx *ctx,yyjson_ptr_err *err)

{
  yyjson_mut_val *pyVar1;
  yyjson_mut_val *pyVar2;
  yyjson_mut_val *pyVar3;
  yyjson_mut_val *pyVar4;
  yyjson_mut_val *pyVar5;
  yyjson_ptr_ctx *pyVar6;
  long lVar7;
  yyjson_mut_val *pyVar8;
  yyjson_ptr_ctx cur_ctx;
  yyjson_ptr_ctx local_38;
  
  local_38.ctn = (yyjson_mut_val *)0x0;
  local_38.pre = (yyjson_mut_val *)0x0;
  local_38.old = (yyjson_mut_val *)0x0;
  pyVar6 = ctx;
  if (ctx == (yyjson_ptr_ctx *)0x0) {
    pyVar6 = &local_38;
  }
  pyVar5 = unsafe_yyjson_mut_ptr_getx(val,ptr,len,pyVar6,err);
  if (pyVar5 == (yyjson_mut_val *)0x0) {
    return (yyjson_mut_val *)0x0;
  }
  pyVar1 = pyVar6->ctn;
  if (pyVar1 == (yyjson_mut_val *)0x0) goto LAB_0124cc4e;
  if ((~(uint)pyVar1->tag & 7) == 0) {
    pyVar6 = ctx;
    if (ctx == (yyjson_ptr_ctx *)0x0) {
      pyVar6 = &local_38;
    }
    if ((((pyVar1 != (yyjson_mut_val *)0x0) && ((~(uint)pyVar1->tag & 7) == 0)) &&
        (pyVar1 = pyVar6->pre->next->next, pyVar1 != (yyjson_mut_val *)0x0)) &&
       ((pyVar1->tag & 7) == 5)) {
      unsafe_yyjson_mut_ptr_removex();
    }
    goto LAB_0124cc4e;
  }
  if (pyVar1 == (yyjson_mut_val *)0x0) goto LAB_0124cc4e;
  pyVar6 = ctx;
  if (ctx == (yyjson_ptr_ctx *)0x0) {
    pyVar6 = &local_38;
  }
  pyVar2 = pyVar6->pre;
  if (pyVar2 == (yyjson_mut_val *)0x0) goto LAB_0124cc4e;
  pyVar3 = pyVar2->next;
  pyVar4 = pyVar3->next;
  if ((~(uint)pyVar1->tag & 7) == 0) {
    pyVar8 = pyVar4->next;
    pyVar3->next = pyVar8->next;
    if ((yyjson_mut_val *)(pyVar1->uni).u64 == pyVar4) {
LAB_0124cc14:
      (pyVar1->uni).u64 = (uint64_t)pyVar2;
    }
  }
  else {
    pyVar2->next = pyVar4;
    pyVar8 = pyVar3;
    if ((yyjson_mut_val *)(pyVar1->uni).u64 == pyVar3) goto LAB_0124cc14;
  }
  pyVar6->pre = (yyjson_mut_val *)0x0;
  pyVar6 = ctx;
  if (ctx == (yyjson_ptr_ctx *)0x0) {
    pyVar6 = &local_38;
  }
  pyVar6->old = pyVar8;
  lVar7 = (pyVar1->tag >> 8) - 1;
  if (lVar7 == 0) {
    (pyVar1->uni).u64 = 0;
  }
  pyVar1->tag = lVar7 * 0x100 | (ulong)(byte)pyVar1->tag;
LAB_0124cc4e:
  pyVar6 = &local_38;
  if (ctx != (yyjson_ptr_ctx *)0x0) {
    pyVar6 = ctx;
  }
  pyVar6->pre = (yyjson_mut_val *)0x0;
  pyVar6->old = pyVar5;
  return pyVar5;
}

Assistant:

yyjson_mut_val *unsafe_yyjson_mut_ptr_removex(yyjson_mut_val *val,
                                              const char *ptr,
                                              size_t len,
                                              yyjson_ptr_ctx *ctx,
                                              yyjson_ptr_err *err) {
    yyjson_mut_val *cur_val;
    yyjson_ptr_ctx cur_ctx;
    memset(&cur_ctx, 0, sizeof(cur_ctx));
    if (!ctx) ctx = &cur_ctx;
    cur_val = unsafe_yyjson_mut_ptr_getx(val, ptr, len, ctx, err);
    if (cur_val) {
        if (yyjson_mut_is_obj(ctx->ctn)) {
            yyjson_mut_val *key = ctx->pre->next->next;
            yyjson_mut_obj_put(ctx->ctn, key, NULL);
        } else {
            yyjson_ptr_ctx_remove(ctx);
        }
        ctx->pre = NULL;
        ctx->old = cur_val;
    }
    return cur_val;
}